

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2D(GatherBase *this,bool base_level)

{
  GLint level;
  GLenum type;
  bool bVar1;
  GLenum internal_format_00;
  GLenum format_00;
  int iVar2;
  reference pixels_00;
  undefined1 local_b8 [8];
  Vec4 data [4];
  allocator<tcu::Vector<float,_4>_> local_59;
  Vector<float,_4> local_58;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  int i;
  GLenum tex_type;
  GLenum target;
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  bool base_level_local;
  GatherBase *this_local;
  
  internal_format_00 =
       (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  format_00 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])();
  tex_type = 0x20;
  if (base_level) {
    tex_type = 0x40;
  }
  iVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1406;
  if (iVar2 == 0x8c43) {
    pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1401;
  }
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             this->tex);
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  for (; 0 < (int)tex_type; tex_type = (int)tex_type / 2) {
    tcu::Vector<float,_4>::Vector(&local_58,1.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_59);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48,
               (long)(int)(tex_type * tex_type),&local_58,&local_59);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_59);
    type = pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    level = (int)pixels.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    pixels_00 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_48,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               level,internal_format_00,tex_type,tex_type,0,format_00,type,pixels_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48);
    pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)pixels.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b8,0.75,0.8125,0.875,0.9375);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[0].m_data + 2),0.5,0.5625,0.625,0.6875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[1].m_data + 2),0.0,0.0625,0.125,0.1875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[2].m_data + 2),0.25,0.3125,0.375,0.4375);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0x16,0x19,2,2,format_00,
             pixels.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_b8);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0x10,10,1,1,format_00,
             pixels.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_b8);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0xb,2,1,1,format_00,
             pixels.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,data[0].m_data + 2);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,0x18,0xd,1,1,format_00,
             pixels.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,data[1].m_data + 2);
  glu::CallLogWrapper::glTexSubImage2D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             (uint)base_level,9,0xe,1,1,format_00,
             pixels.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,data[2].m_data + 2);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
             0x8072,0x812f);
  bVar1 = IsFloatingPointTexture(this,internal_format_00);
  if (bVar1) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               0x2801,0x2700);
  }
  if (base_level) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0xde1,
               0x813c,1);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2D(bool base_level = false)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= InternalFormat() == GL_SRGB8_ALPHA8 ? GL_UNSIGNED_BYTE : GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size, Vec4(1.0));
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, &pixels[0]);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}

		if (base_level)
			glTexParameteri(target, GL_TEXTURE_BASE_LEVEL, 1);
	}